

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O2

size_t g12sSign_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar1 = zzMod_deep(n,n);
  sVar2 = ecMulA_deep(n,ec_d,ec_deep,n);
  sVar3 = zzMulMod_deep(n);
  sVar1 = utilMax(3,sVar1,sVar2,sVar3);
  return sVar1 + n * 0x28;
}

Assistant:

static size_t g12sSign_deep(size_t n, size_t f_deep, size_t ec_d, 
	size_t ec_deep)
{
	const size_t m = n;
	return 	O_OF_W(3 * m + 2 * n) +
		utilMax(3,
			zzMod_deep(m, m),
			ecMulA_deep(n, ec_d, ec_deep, n),
			zzMulMod_deep(m));
}